

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTDG.cpp
# Opt level: O3

void __thiscall
NaPNTrainDataGath::set_parameters
          (NaPNTrainDataGath *this,int n_stpardet,int n_cells,NaReal n_sigma,NaReal percent)

{
  int iVar1;
  NaReal NVar2;
  
  if (n_stpardet < 2) {
    n_stpardet = 1;
  }
  this->nStDetLen = n_stpardet;
  NVar2 = 0.0;
  if (0.0 <= percent) {
    NVar2 = percent;
  }
  this->fMinHits = NVar2;
  iVar1 = 1;
  if (1 < n_cells) {
    iVar1 = n_cells;
  }
  this->par[1].nCells = iVar1;
  this->par[0].nCells = iVar1;
  NVar2 = (NaReal)(~-(ulong)(n_sigma <= 0.0) & (ulong)n_sigma |
                  -(ulong)(n_sigma <= 0.0) & 0x3ff0000000000000);
  this->par[1].fNSigma = NVar2;
  this->par[0].fNSigma = NVar2;
  return;
}

Assistant:

void
NaPNTrainDataGath::set_parameters (int n_stpardet, int n_cells,
				   NaReal n_sigma, NaReal percent)
{
  nStDetLen = (n_stpardet < 1)? 1: n_stpardet;
  fMinHits = (percent < 0)? 0.0: percent;

  par[0].nCells = par[1].nCells = (n_cells < 1)? 1: n_cells;
  par[0].fNSigma = par[1].fNSigma = (n_sigma <= 0.0)? 1.0: n_sigma;
}